

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O2

char * TxtReplace(char *in_str,char *in_substr,char *out_substr,int recurse)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  
  if (in_str == (char *)0x0) {
    in_str = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_str);
    sVar2 = strlen(in_substr);
    iVar6 = (int)sVar1;
    iVar11 = (int)sVar2;
    if (iVar11 != 0 && iVar6 != 0) {
      sVar1 = strlen(out_substr);
      pcVar3 = strstr(in_str,in_substr);
      iVar7 = (int)sVar1;
      uVar9 = iVar7 - iVar11;
      if (uVar9 == 0 || iVar7 < iVar11) {
        sVar1 = (size_t)iVar7;
        for (; pcVar3 != (char *)0x0; pcVar3 = strstr(pcVar3,in_substr)) {
          if (iVar7 != 0) {
            memcpy(pcVar3,out_substr,sVar1);
          }
          pcVar4 = pcVar3;
          if (iVar7 != iVar11) {
            for (; pcVar4[iVar11] != '\0'; pcVar4 = pcVar4 + 1) {
              pcVar4[sVar1] = pcVar4[iVar11];
            }
            pcVar4[sVar1] = '\0';
          }
          pcVar3 = pcVar3 + sVar1;
          if (recurse != 0) {
            pcVar3 = in_str;
          }
        }
      }
      else {
        iVar12 = iVar6 + 1;
        iVar8 = 0;
        while (pcVar3 != (char *)0x0) {
          iVar8 = iVar8 + 1;
          pcVar3 = strstr(pcVar3 + iVar11,in_substr);
          iVar12 = iVar12 + uVar9;
        }
        if (iVar8 != 0) {
          pcVar3 = (char *)realloc(in_str,(long)iVar12);
          pcVar4 = strstr(pcVar3,in_substr);
          uVar13 = (ulong)uVar9;
          lVar10 = (long)iVar6;
          while( true ) {
            bVar14 = iVar8 == 0;
            iVar8 = iVar8 + -1;
            if ((pcVar4 == (char *)0x0) || (bVar14)) break;
            for (pcVar5 = pcVar3 + lVar10; pcVar5 != pcVar4 + ((long)iVar11 - uVar13);
                pcVar5 = pcVar5 + -1) {
              pcVar5[uVar13] = *pcVar5;
            }
            lVar10 = lVar10 + uVar13;
            memcpy(pcVar4,out_substr,(long)iVar7);
            pcVar4 = pcVar4 + iVar7;
            if (recurse != 0) {
              pcVar4 = in_str;
            }
            pcVar4 = strstr(pcVar4,in_substr);
          }
          in_str = pcVar3;
          if (pcVar4 != (char *)0x0) {
            printf("INTERNAL ERROR - overlapping replace string (%s/%s), you can\'t use this one!\n"
                   ,in_substr,out_substr);
            exit(7);
          }
        }
      }
    }
  }
  return in_str;
}

Assistant:

char *TxtReplace(char *in_str, char *in_substr, char *out_substr, int recurse)
{
	#undef FUNC
	#define FUNC "TxtReplace"
	
	char *str_look,*m1,*m2;
	char *out_str;
	int sl,l1,l2,dif,cpt;

	if (in_str==NULL)
		return NULL;
		
	sl=strlen(in_str);
	l1=strlen(in_substr);
	/* empty string, nothing to do except return empty string */
	if (!sl || !l1)
		return in_str;
		
	l2=strlen(out_substr);
	dif=l2-l1;
		
	/* replace string is small or equal in size, we dont realloc */
	if (dif<=0)
	{
		/* we loop while there is a replace to do */
		str_look=strstr(in_str,in_substr);
		while (str_look!=NULL)
		{
			/*logdebug(str_look);*/
			
			/* we copy the new string if his len is not null */
			if (l2)
				memcpy(str_look,out_substr,l2);
			/* only if len are different */
			if (l1!=l2)
			{
				/* we move the end of the string byte per byte
				   because memory locations overlap. This is
				   faster than memmove */
				m1=str_look+l1;
				m2=str_look+l2;
				while (*m1!=0)
				{
					*m2=*m1;
					m1++;m2++;
				}
				/* we must copy the EOL */
				*m2=*m1;
			}
			/* look for next replace */
			if (!recurse)
				str_look=strstr(str_look+l2,in_substr);
			else
				str_look=strstr(in_str,in_substr);
		}
		out_str=in_str;
	}
	else
	{
		/* we need to count each replace */
		cpt=0;
		str_look=strstr(in_str,in_substr);
		while (str_look!=NULL)
		{
			cpt++;
			str_look=strstr(str_look+l1,in_substr);
		}
		/* is there anything to do? */
		if (cpt)
		{
			/* we realloc to a size that will fit all replaces */
			out_str=MemRealloc(in_str,sl+1+dif*cpt);
			str_look=strstr(out_str,in_substr);
			while (str_look!=NULL && cpt)
			{
				/* as the replace string is bigger we
				   have to move memory first from the end */
				m1=out_str+sl;
				m2=m1+dif;
				sl+=dif;
				while (m1!=str_look+l1-dif)
				{
					*m2=*m1;
					m1--;m2--;
				}
				/* then we copy the replace string (can't be NULL in this case) */
				memcpy(str_look,out_substr,l2);
				
				/* look for next replace */
				if (!recurse)
					str_look=strstr(str_look+l2,in_substr);
				else
					str_look=strstr(in_str,in_substr);
					
				/* to prevent from naughty overlap */
				cpt--;
			}
			if (str_look!=NULL)
			{
				printf("INTERNAL ERROR - overlapping replace string (%s/%s), you can't use this one!\n",in_substr,out_substr);
				exit(ABORT_ERROR);
			}
		}
		else
			out_str=in_str;
	}
	return out_str;
}